

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O0

void UnityAssertFloatSpecial(_UF actual,char *msg,_U_UINT lineNumber,UNITY_FLOAT_TRAIT_T style)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong local_60;
  _U_SINT trait_index;
  _U_SINT is_trait;
  _U_SINT should_be_trait;
  char *trait_names [4];
  UNITY_FLOAT_TRAIT_T style_local;
  _U_UINT lineNumber_local;
  char *msg_local;
  _UF actual_local;
  
  trait_names[0] = "Negative Infinity";
  trait_names[1] = "NaN";
  trait_names[2] = "Determinate";
  trait_index = (_U_SINT)(int)(uint)((style & UNITY_FLOAT_IS_INF) == UNITY_FLOAT_IS_NOT_INF);
  local_60 = (ulong)(style >> 1);
  if ((Unity.CurrentTestFailed == 0) && (Unity.CurrentTestIgnored == 0)) {
    switch(style) {
    case UNITY_FLOAT_IS_NOT_INF:
    case UNITY_FLOAT_IS_INF:
      uVar3 = 1;
      if ((int)actual < 0) {
        uVar3 = 0xffffffff;
      }
      uVar1 = 0;
      if (ABS(actual) == INFINITY) {
        uVar1 = uVar3;
      }
      trait_index = (_U_SINT)(int)(uVar1 & 0.0 < actual);
      break;
    case UNITY_FLOAT_IS_NOT_NEG_INF:
    case UNITY_FLOAT_IS_NEG_INF:
      uVar3 = 1;
      if ((int)actual < 0) {
        uVar3 = 0xffffffff;
      }
      uVar1 = 0;
      if (ABS(actual) == INFINITY) {
        uVar1 = uVar3;
      }
      trait_index = (_U_SINT)(int)(uVar1 & actual < 0.0);
      break;
    case UNITY_FLOAT_IS_NOT_NAN:
    case UNITY_FLOAT_IS_NAN:
      trait_index = (_U_SINT)(int)(uint)NAN(actual);
      break;
    case UNITY_FLOAT_IS_NOT_DET:
    case UNITY_FLOAT_IS_DET:
      iVar4 = 1;
      if ((int)actual < 0) {
        iVar4 = -1;
      }
      iVar2 = 0;
      if (ABS(actual) == INFINITY) {
        iVar2 = iVar4;
      }
      trait_index = (_U_SINT)(iVar2 == 0 && !NAN(actual));
      break;
    default:
      local_60 = 0;
    }
    if (trait_index != ((ulong)style & 1)) {
      trait_names[3]._4_4_ = style;
      UnityTestResultsFailBegin(lineNumber);
      UnityPrint(" Expected ");
      if ((style & UNITY_FLOAT_IS_INF) == UNITY_FLOAT_IS_NOT_INF) {
        UnityPrint("Not ");
      }
      UnityPrint(trait_names[local_60 - 1]);
      UnityPrint(" Was ");
      if ((style & UNITY_FLOAT_IS_INF) != UNITY_FLOAT_IS_NOT_INF) {
        UnityPrint("Not ");
      }
      UnityPrint(trait_names[local_60 - 1]);
      UnityAddMsgIfSpecified(msg);
      Unity.CurrentTestFailed = 1;
      longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
    }
  }
  return;
}

Assistant:

void UnityAssertFloatSpecial(const _UF actual,
                             const char* msg,
                             const UNITY_LINE_TYPE lineNumber,
                             const UNITY_FLOAT_TRAIT_T style)
{
    const char* trait_names[] = { UnityStrInf, UnityStrNegInf, UnityStrNaN, UnityStrDet };
    _U_SINT should_be_trait   = ((_U_SINT)style & 1);
    _U_SINT is_trait          = !should_be_trait;
    _U_SINT trait_index       = (_U_SINT)(style >> 1);

    UNITY_SKIP_EXECUTION;

    switch(style)
    {
        case UNITY_FLOAT_IS_INF:
        case UNITY_FLOAT_IS_NOT_INF:
            is_trait = isinf(actual) & ispos(actual);
            break;
        case UNITY_FLOAT_IS_NEG_INF:
        case UNITY_FLOAT_IS_NOT_NEG_INF:
            is_trait = isinf(actual) & isneg(actual);
            break;

        case UNITY_FLOAT_IS_NAN:
        case UNITY_FLOAT_IS_NOT_NAN:
            is_trait = isnan(actual);
            break;

        /* A determinate number is non infinite and not NaN. (therefore the opposite of the two above) */
        case UNITY_FLOAT_IS_DET:
        case UNITY_FLOAT_IS_NOT_DET:
            if (isinf(actual) | isnan(actual))
                is_trait = 0;
            else
                is_trait = 1;
            break;

        default:
            trait_index = 0;
            trait_names[0] = UnityStrInvalidFloatTrait;
            break;
    }

    if (is_trait != should_be_trait)
    {
        UnityTestResultsFailBegin(lineNumber);
        UnityPrint(UnityStrExpected);
        if (!should_be_trait)
            UnityPrint(UnityStrNot);
        UnityPrint(trait_names[trait_index]);
        UnityPrint(UnityStrWas);
#ifdef UNITY_FLOAT_VERBOSE
        UnityPrintFloat(actual);
#else
        if (should_be_trait)
            UnityPrint(UnityStrNot);
        UnityPrint(trait_names[trait_index]);
#endif
        UnityAddMsgIfSpecified(msg);
        UNITY_FAIL_AND_BAIL;
    }
}